

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::structtype<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *__return_storage_ptr___00;
  bool bVar1;
  Ok *pOVar2;
  basic_string_view<char,_std::char_traits<char>_> expected;
  Ok local_fa;
  allocator<char> local_f9;
  string local_f8;
  Err local_d8;
  uint local_b4;
  Err local_b0;
  Err *local_90;
  Err *err;
  undefined1 local_78 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> namedFields;
  ParseDeclsCtx *ctx_local;
  
  expected = sv("struct",6);
  bVar1 = Lexer::takeSExprStart(&ctx->in,expected);
  if (bVar1) {
    __return_storage_ptr___00 =
         (__index_type *)
         ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                 super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                 super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                 super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    fields<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)__return_storage_ptr___00,ctx);
    Result<wasm::Ok>::Result
              ((Result<wasm::Ok> *)local_78,(Result<wasm::Ok> *)__return_storage_ptr___00);
    local_90 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_78);
    bVar1 = local_90 != (Err *)0x0;
    if (bVar1) {
      wasm::Err::Err(&local_b0,local_90);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_b0);
      wasm::Err::~Err(&local_b0);
    }
    local_b4 = (uint)bVar1;
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_78);
    if (local_b4 == 0) {
      bVar1 = Lexer::takeRParen(&ctx->in);
      if (bVar1) {
        pOVar2 = Result<wasm::Ok>::operator*
                           ((Result<wasm::Ok> *)
                            ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        NullTypeParserCtx::makeStruct((NullTypeParserCtx *)ctx,pOVar2);
        MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_fa);
        local_b4 = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_f8,"expected end of struct definition",&local_f9);
        Lexer::err(&local_d8,&ctx->in,&local_f8);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_d8);
        wasm::Err::~Err(&local_d8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::allocator<char>::~allocator(&local_f9);
        local_b4 = 1;
      }
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
  }
  else {
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::StructT> structtype(Ctx& ctx) {
  if (!ctx.in.takeSExprStart("struct"sv)) {
    return {};
  }
  auto namedFields = fields(ctx);
  CHECK_ERR(namedFields);
  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected end of struct definition");
  }

  return ctx.makeStruct(*namedFields);
}